

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort min;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  int *in_RSI;
  int *in_RDI;
  int32_t stop;
  int32_t start;
  int i;
  int32_t stop_pos;
  int32_t start_pos;
  run_container_t *in_stack_ffffffffffffffc8;
  int local_24;
  int32_t local_20;
  _Bool local_1;
  
  iVar1 = run_container_cardinality(in_stack_ffffffffffffffc8);
  if (*in_RSI < iVar1) {
    local_1 = false;
  }
  else {
    local_20 = -1;
    for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
      min = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4);
      uVar2 = (uint)min;
      uVar3 = uVar2 + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4);
      iVar4 = advanceUntil(*(uint16_t **)(in_RSI + 2),local_20,*in_RSI,min);
      local_20 = advanceUntil(*(uint16_t **)(in_RSI + 2),local_20,*in_RSI,(uint16_t)uVar3);
      if (local_20 == *in_RSI) {
        return false;
      }
      if (((local_20 - iVar4 != uVar3 - uVar2) ||
          (*(ushort *)(*(long *)(in_RSI + 2) + (long)iVar4 * 2) != uVar2)) ||
         (*(ushort *)(*(long *)(in_RSI + 2) + (long)local_20 * 2) != uVar3)) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (stop_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}